

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseAction(WastParser *this,ActionPtr *out_action)

{
  Action *pAVar1;
  _Alloc_hider _Var2;
  Result RVar3;
  TokenType TVar4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Token local_1d8;
  Token local_188;
  Var local_138;
  Var local_f0;
  undefined1 local_a8 [8];
  Location loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [37];
  allocator local_2b;
  allocator local_2a;
  allocator_type local_29;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ != Error) {
    GetLocation((Location *)local_a8,this);
    TVar4 = Peek(this,0);
    if (TVar4 == Get) {
      Consume(&local_188,this);
      Token::~Token(&local_188);
      MakeUnique<wabt::GetAction,wabt::Location&>((wabt *)&local_70,(Location *)local_a8);
      _Var2._M_p = local_70._M_dataplus._M_p;
      Var::Var(&local_f0,this->last_module_index_,(Location *)local_a8);
      ParseVarOpt(this,(Var *)(_Var2._M_p + 0x28),&local_f0);
      Var::~Var(&local_f0);
      RVar3 = ParseQuotedText(this,(string *)(local_70._M_dataplus._M_p + 0x70));
      _Var2._M_p = local_70._M_dataplus._M_p;
      if (RVar3.enum_ != Error) {
        local_70._M_dataplus._M_p = (pointer)0x0;
        pAVar1 = (out_action->_M_t).
                 super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
                 super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
                 super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
        (out_action->_M_t).super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>.
        _M_t.super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
        super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl = (Action *)_Var2._M_p;
        if (pAVar1 == (Action *)0x0) goto LAB_00dac175;
        (*pAVar1->_vptr_Action[1])();
      }
      if ((Action *)local_70._M_dataplus._M_p != (Action *)0x0) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      if (RVar3.enum_ != Error) goto LAB_00dac175;
    }
    else {
      if (TVar4 != Invoke) {
        std::__cxx11::string::string((string *)&local_70,"invoke",&local_2b);
        std::__cxx11::string::string(local_50,"get",&local_2a);
        __l._M_len = 2;
        __l._M_array = &local_70;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&loc.field_1 + 8),__l,&local_29);
        RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&loc.field_1 + 8),(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&loc.field_1 + 8));
        lVar5 = 0x20;
        do {
          std::__cxx11::string::~string((string *)((long)&local_70._M_dataplus._M_p + lVar5));
          lVar5 = lVar5 + -0x20;
        } while (lVar5 != -0x20);
        return (Result)RVar3.enum_;
      }
      Consume(&local_1d8,this);
      Token::~Token(&local_1d8);
      MakeUnique<wabt::InvokeAction,wabt::Location&>((wabt *)&local_70,(Location *)local_a8);
      _Var2._M_p = local_70._M_dataplus._M_p;
      Var::Var(&local_138,this->last_module_index_,(Location *)local_a8);
      ParseVarOpt(this,(Var *)(_Var2._M_p + 0x28),&local_138);
      Var::~Var(&local_138);
      RVar3 = ParseQuotedText(this,(string *)(local_70._M_dataplus._M_p + 0x70));
      if ((RVar3.enum_ != Error) &&
         (RVar3 = ParseConstList(this,(ConstVector *)(local_70._M_dataplus._M_p + 0x98)),
         _Var2._M_p = local_70._M_dataplus._M_p, RVar3.enum_ != Error)) {
        local_70._M_dataplus._M_p = (pointer)0x0;
        pAVar1 = (out_action->_M_t).
                 super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
                 super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
                 super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
        (out_action->_M_t).super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>.
        _M_t.super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
        super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl = (Action *)_Var2._M_p;
        if ((pAVar1 != (Action *)0x0) &&
           ((*pAVar1->_vptr_Action[1])(), (Action *)local_70._M_dataplus._M_p != (Action *)0x0)) {
          (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
        }
LAB_00dac175:
        RVar3 = Expect(this,Rpar);
        return (Result)(uint)(RVar3.enum_ == Error);
      }
      if ((Action *)local_70._M_dataplus._M_p != (Action *)0x0) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
    }
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseAction(ActionPtr* out_action) {
  WABT_TRACE(ParseAction);
  EXPECT(Lpar);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Invoke: {
      Consume();
      auto action = MakeUnique<InvokeAction>(loc);
      ParseVarOpt(&action->module_var, Var(last_module_index_, loc));
      CHECK_RESULT(ParseQuotedText(&action->name));
      CHECK_RESULT(ParseConstList(&action->args));
      *out_action = std::move(action);
      break;
    }

    case TokenType::Get: {
      Consume();
      auto action = MakeUnique<GetAction>(loc);
      ParseVarOpt(&action->module_var, Var(last_module_index_, loc));
      CHECK_RESULT(ParseQuotedText(&action->name));
      *out_action = std::move(action);
      break;
    }

    default:
      return ErrorExpected({"invoke", "get"});
  }
  EXPECT(Rpar);
  return Result::Ok;
}